

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O2

void __thiscall
CivetServer::CivetServer
          (CivetServer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *options,CivetCallbacks *_callbacks,void *UserContextIn)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  long lVar3;
  mg_context *pmVar4;
  CivetException *this_00;
  ulong uVar5;
  _func_void_mg_connection_ptr *p_Var6;
  allocator local_231;
  vector<const_char_*,_std::allocator<const_char_*>_> pointers;
  string exceptionMsg;
  mg_error_data local_1f8;
  mg_init_data local_1e0;
  CivetCallbacks callbacks;
  char errtxtbuf [256];
  
  this->_vptr_CivetServer = (_func_int **)&PTR__CivetServer_0017c798;
  this->context = (mg_context *)0x0;
  p_Var1 = &(this->connections)._M_t._M_impl.super__Rb_tree_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var6 = (_func_void_mg_connection_ptr *)0x0;
  memset(&callbacks.super_mg_callbacks,0,0x90);
  this->UserContext = UserContextIn;
  if (_callbacks != (CivetCallbacks *)0x0) {
    memcpy(&callbacks,_callbacks,0x90);
    p_Var6 = (_callbacks->super_mg_callbacks).connection_close;
  }
  this->userCloseHandler = p_Var6;
  callbacks.super_mg_callbacks.connection_close = closeHandler;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&pointers,
             ((long)(options->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(options->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) + 1,(allocator_type *)errtxtbuf
            );
  lVar3 = 0;
  for (uVar5 = 0;
      pbVar2 = (options->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(options->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
      uVar5 = uVar5 + 1) {
    *(undefined8 *)
     ((long)pointers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start + lVar3) =
         *(undefined8 *)((long)&(pbVar2->_M_dataplus)._M_p + lVar3 * 4);
    lVar3 = lVar3 + 8;
  }
  pointers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish[-1] = (char *)0x0;
  local_1e0.configuration_options =
       pointers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1f8.code = 0;
  local_1f8.code_sub = 0;
  local_1e0.callbacks = &callbacks.super_mg_callbacks;
  local_1e0.user_data = this;
  memset((allocator_type *)errtxtbuf,0,0x100);
  local_1f8.text_buffer_size = 0x100;
  local_1f8.text = errtxtbuf;
  pmVar4 = mg_start2(&local_1e0,&local_1f8);
  this->context = pmVar4;
  if (pmVar4 != (mg_context *)0x0) {
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&pointers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    return;
  }
  std::__cxx11::string::string
            ((string *)&exceptionMsg,
             "null context when constructing CivetServer. Possible problem binding to port. Error: "
             ,&local_231);
  std::__cxx11::string::append((char *)&exceptionMsg);
  this_00 = (CivetException *)__cxa_allocate_exception(0x10);
  CivetException::CivetException(this_00,&exceptionMsg);
  __cxa_throw(this_00,&CivetException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CivetServer::CivetServer(const std::vector<std::string> &options,
                         const struct CivetCallbacks *_callbacks,
                         const void *UserContextIn)
    : context(0)
{
	struct CivetCallbacks callbacks;

	UserContext = UserContextIn;

	if (_callbacks) {
		callbacks = *_callbacks;
		userCloseHandler = _callbacks->connection_close;
	} else {
		userCloseHandler = NULL;
	}
	callbacks.connection_close = closeHandler;

	std::vector<const char *> pointers(options.size() + 1);
	for (size_t i = 0; i < options.size(); i++) {
		pointers[i] = (options[i].c_str());
	}
	pointers.back() = NULL;

	struct mg_init_data mg_start_init_data = {0};
	mg_start_init_data.callbacks = &callbacks;
	mg_start_init_data.user_data = this;
	mg_start_init_data.configuration_options = &pointers[0];

	struct mg_error_data mg_start_error_data = {0};
	char errtxtbuf[256] = {0};
	mg_start_error_data.text = errtxtbuf;
	mg_start_error_data.text_buffer_size = sizeof(errtxtbuf);

	context = mg_start2(&mg_start_init_data, &mg_start_error_data);

	if (context == NULL) {
		std::string exceptionMsg =
		    "null context when constructing CivetServer. "
		    "Possible problem binding to port. Error: ";
		exceptionMsg += errtxtbuf;
		throw CivetException(exceptionMsg);
	}
}